

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O1

bool chaiscript::dispatch::detail::
     types_match_except_for_arithmetic<chaiscript::dispatch::Proxy_Function_Base_const*>
               (Proxy_Function_Base **t_func,
               vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *plist,
               Type_Conversions_State *t_conversions)

{
  Proxy_Function_Base *pPVar1;
  pair<__gnu_cxx::__normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>,___gnu_cxx::__normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>_>
  pVar2;
  bool bVar3;
  pair<__gnu_cxx::__normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>,___gnu_cxx::__normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>_>
  pVar4;
  
  pPVar1 = *t_func;
  if (pPVar1->m_arity == -1) {
    bVar3 = false;
  }
  else {
    pVar4 = std::
            __mismatch<__gnu_cxx::__normal_iterator<chaiscript::Boxed_Value_const*,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>,__gnu_cxx::__normal_iterator<chaiscript::Type_Info_const*,std::vector<chaiscript::Type_Info,std::allocator<chaiscript::Type_Info>>>,__gnu_cxx::__ops::_Iter_comp_iter<chaiscript::dispatch::detail::types_match_except_for_arithmetic<chaiscript::dispatch::Proxy_Function_Base_const*>(chaiscript::dispatch::Proxy_Function_Base_const*const&,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const&,chaiscript::Type_Conversions_State_const&)::_lambda(chaiscript::Boxed_Value_const&,chaiscript::Type_Info_const&)_1_>>
                      ((plist->
                       super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                       )._M_impl.super__Vector_impl_data._M_start,
                       (plist->
                       super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                       )._M_impl.super__Vector_impl_data._M_finish,
                       (pPVar1->m_types).
                       super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1,
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mrzv[P]henson_include_chaiscript_dispatchkit_proxy_functions_hpp:795:32)>
                        )t_conversions);
    pVar2.second._M_current =
         (pPVar1->m_types).
         super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pVar2.first._M_current =
         (plist->
         super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    bVar3 = pVar4 == pVar2;
  }
  return bVar3;
}

Assistant:

bool types_match_except_for_arithmetic(const FuncType &t_func, const std::vector<Boxed_Value> &plist,
            const Type_Conversions_State &t_conversions)
        {
          const std::vector<Type_Info> &types = t_func->get_param_types();

          if (t_func->get_arity() == -1) return false;

          assert(plist.size() == types.size() - 1);

          return std::mismatch(plist.begin(), plist.end(),
                               types.begin()+1,
                               [&](const Boxed_Value &bv, const Type_Info &ti) {
                                 return Proxy_Function_Base::compare_type_to_param(ti, bv, t_conversions)
                                       || (bv.get_type_info().is_arithmetic() && ti.is_arithmetic());
                               }
              ) == std::make_pair(plist.end(), types.end());
        }